

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_glnodes.cpp
# Opt level: O3

bool P_LoadGLNodes(MapData *map)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  int wadnum;
  int iVar5;
  int iVar6;
  FILE *__stream;
  size_t sVar7;
  FileReader *pFVar8;
  char *pcVar9;
  FWadLump *pFVar10;
  FResourceFile *pFVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar12;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined8 uVar13;
  void *__ptr;
  uint *puVar14;
  long lVar15;
  uint i;
  long lVar16;
  char (*__s2) [9];
  uint uVar17;
  char hdata [8];
  uint i_1;
  undefined1 auVar18 [16];
  char magic [4];
  FString path;
  BYTE md5map [16];
  BYTE md5 [16];
  int id;
  undefined4 local_19c;
  undefined1 local_198 [17];
  char cStack_187;
  char cStack_186;
  char cStack_185;
  char cStack_184;
  char cStack_183;
  char cStack_182;
  char cStack_181;
  char cStack_180;
  char cStack_17f;
  char cStack_17e;
  char cStack_17d;
  char cStack_17c;
  char cStack_17b;
  char cStack_17a;
  char cStack_179;
  uint local_16c;
  MapLump local_168;
  MapLump local_158;
  FileReader *local_140;
  MemoryReader local_138 [4];
  
  pFVar8 = map->MapLumps[6].Reader;
  local_198._8_8_ = map;
  if ((pFVar8 != (FileReader *)0x0) && (pFVar8->Length != 0)) {
    map->file = pFVar8;
    (*(pFVar8->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar8,0,0);
    (*(map->file->super_FileReaderBase)._vptr_FileReaderBase[2])(map->file,local_138,4);
    if ((int)(DWORD)local_138[0].super_FileReader.super_FileReaderBase._vptr_FileReaderBase <
        0x334c475a) {
      if ((((DWORD)local_138[0].super_FileReader.super_FileReaderBase._vptr_FileReaderBase ==
            0x324c4758) ||
          ((DWORD)local_138[0].super_FileReader.super_FileReaderBase._vptr_FileReaderBase ==
           0x324c475a)) ||
         ((DWORD)local_138[0].super_FileReader.super_FileReaderBase._vptr_FileReaderBase ==
          0x334c4758)) {
LAB_003fa0eb:
        subsectors = (subsector_t *)0x0;
        segs = (seg_t *)0x0;
        nodes = (node_t *)0x0;
        P_LoadZNodes(map->file,
                     (DWORD)local_138[0].super_FileReader.super_FileReaderBase._vptr_FileReaderBase)
        ;
        return true;
      }
    }
    else if ((((DWORD)local_138[0].super_FileReader.super_FileReaderBase._vptr_FileReaderBase ==
               0x334c475a) ||
             ((DWORD)local_138[0].super_FileReader.super_FileReaderBase._vptr_FileReaderBase ==
              0x4e4c475a)) ||
            ((DWORD)local_138[0].super_FileReader.super_FileReaderBase._vptr_FileReaderBase ==
             0x4e4c4758)) goto LAB_003fa0eb;
  }
  local_19c = 0;
  CreateCacheName((MapData *)local_198,SUB81(map,0));
  __stream = fopen((char *)local_198._0_8_,"rb");
  if (__stream == (FILE *)0x0) {
LAB_003fa21a:
    FString::~FString((FString *)local_198);
  }
  else {
    sVar7 = fread(&local_19c,1,4,__stream);
    if (((sVar7 != 4) || (local_19c != 0x48434143)) ||
       ((sVar7 = fread(&local_16c,4,1,__stream), sVar7 != 1 ||
        ((local_16c != numlines || (sVar7 = fread(&local_168,1,0x10,__stream), sVar7 != 0x10)))))) {
LAB_003fa212:
      fclose(__stream);
      goto LAB_003fa21a;
    }
    MapData::GetChecksum(map,local_198 + 0x10);
    auVar18[0] = -(local_168.Name[0] == local_198[0x10]);
    auVar18[1] = -(local_168.Name[1] == cStack_187);
    auVar18[2] = -(local_168.Name[2] == cStack_186);
    auVar18[3] = -(local_168.Name[3] == cStack_185);
    auVar18[4] = -(local_168.Name[4] == cStack_184);
    auVar18[5] = -(local_168.Name[5] == cStack_183);
    auVar18[6] = -(local_168.Name[6] == cStack_182);
    auVar18[7] = -(local_168.Name[7] == cStack_181);
    auVar18[8] = -((char)local_168.Reader == cStack_180);
    auVar18[9] = -(local_168.Reader._1_1_ == cStack_17f);
    auVar18[10] = -(local_168.Reader._2_1_ == cStack_17e);
    auVar18[0xb] = -(local_168.Reader._3_1_ == cStack_17d);
    auVar18[0xc] = -(local_168.Reader._4_1_ == cStack_17c);
    auVar18[0xd] = -(local_168.Reader._5_1_ == cStack_17b);
    auVar18[0xe] = -(local_168.Reader._6_1_ == cStack_17a);
    auVar18[0xf] = -(local_168.Reader._7_1_ == cStack_179);
    map = (MapData *)local_198._8_8_;
    if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe | (ushort)(auVar18[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_003fa212;
    __ptr = operator_new__((ulong)(local_16c * 8) << 2);
    sVar7 = fread(__ptr,8,(ulong)local_16c,__stream);
    if (((sVar7 == local_16c) && (sVar7 = fread(&local_19c,1,4,__stream), sVar7 == 4)) &&
       ((local_19c & 0xfeffffff) == 0x324c475a)) {
      lVar16 = ftell(__stream);
      FileReader::FileReader(&local_138[0].super_FileReader,(FILE *)__stream);
      FileReader::Seek(&local_138[0].super_FileReader,lVar16,0);
      P_LoadZNodes(&local_138[0].super_FileReader,
                   local_19c & 0xff000000 | (int)local_19c._2_1_ << 0x10 |
                   (int)local_19c._1_1_ << 8 | (int)(char)local_19c);
      MemoryReader::~MemoryReader(local_138);
      lVar16 = (long)numlines;
      if (0 < lVar16) {
        puVar14 = (uint *)((long)__ptr + 4);
        lVar15 = 0;
        do {
          *(vertex_t **)(lines->args + lVar15 * 2 + -0xb) = vertexes + puVar14[-1];
          *(vertex_t **)(lines->args + lVar15 * 2 + -9) = vertexes + *puVar14;
          lVar15 = lVar15 + 0x13;
          puVar14 = puVar14 + 2;
        } while (lVar16 * 0x13 != lVar15);
      }
      operator_delete__(__ptr);
      fclose(__stream);
      FString::~FString((FString *)local_198);
      return true;
    }
    operator_delete__(__ptr);
    fclose(__stream);
    FString::~FString((FString *)local_198);
    map = (MapData *)local_198._8_8_;
  }
  local_158.Name[0] = '\0';
  local_158.Name[1] = '\0';
  local_158.Name[2] = '\0';
  local_158.Name[3] = '\0';
  local_158.Name[4] = '\0';
  local_158.Name[5] = '\0';
  local_158.Name[6] = '\0';
  local_158.Name[7] = '\0';
  local_158.Reader = (FileReader *)0x0;
  local_168.Name[0] = '\0';
  local_168.Name[1] = '\0';
  local_168.Name[2] = '\0';
  local_168.Name[3] = '\0';
  local_168.Name[4] = '\0';
  local_168.Name[5] = '\0';
  local_168.Name[6] = '\0';
  local_168.Name[7] = '\0';
  local_168.Reader = (FileReader *)0x0;
  iVar4 = FWadCollection::GetLumpFile(&Wads,map->lumpnum);
  bVar3 = map->InWad;
  pFVar11 = map->resource;
  pFVar8 = (FileReader *)FWadCollection::GetWadFullName(&Wads,iVar4);
  if (bVar3 == true) {
    iVar4 = map->lumpnum;
    local_140 = pFVar8;
    wadnum = FWadCollection::GetLumpFile(&Wads,iVar4);
    local_138[0].super_FileReader.super_FileReaderBase._vptr_FileReaderBase = (_func_int **)0x723dac
    ;
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
    pcVar9 = FWadCollection::GetLumpFullName(&Wads,iVar4);
    FString::Format((FString *)local_138,"GL_%s",pcVar9);
    if (*(uint *)((long)local_138[0].super_FileReader.super_FileReaderBase._vptr_FileReaderBase +
                 -0xc) < 9) {
      iVar5 = FWadCollection::CheckNumForName
                        (&Wads,(char *)local_138[0].super_FileReader.super_FileReaderBase.
                                       _vptr_FileReaderBase,0,wadnum,true);
      if (-1 < iVar5) {
LAB_003fa3a4:
        FString::~FString((FString *)local_138);
        lVar16 = 0;
        do {
          pFVar10 = FWadCollection::ReopenLumpNum(&Wads,(int)lVar16 + iVar5 + 1);
          *(FWadLump **)(local_168.Name + lVar16 * 8) = pFVar10;
          lVar16 = lVar16 + 1;
        } while (lVar16 != 4);
        bVar3 = DoLoadGLNodes((FileReader **)&local_168);
        return bVar3;
      }
    }
    else {
      iVar5 = FWadCollection::CheckNumForName(&Wads,"GL_LEVEL",0,wadnum,true);
      if (-1 < iVar5) {
        local_198._0_8_ = local_198._0_8_ & 0xffffffff00000000;
        do {
          do {
            iVar5 = FWadCollection::FindLump(&Wads,"GL_LEVEL",(int *)local_198,false);
            if (iVar5 < 0) goto LAB_003fa3e7;
            iVar6 = FWadCollection::GetLumpFile(&Wads,iVar5);
          } while (iVar6 != wadnum);
          FWadCollection::ReadLump((FWadCollection *)(local_198 + 0x10),0x1c70340);
          pcVar9 = FWadCollection::GetLumpFullName(&Wads,iVar4);
          hdata[0] = '\0';
          hdata[1] = '\0';
          hdata[2] = '\0';
          hdata[3] = '\0';
          hdata[4] = '\0';
          hdata[5] = '\0';
          hdata[6] = '\0';
          hdata[7] = '\0';
          if (*(int *)((long)stack0xfffffffffffffe78 + -0xc) != 0) {
            hdata = stack0xfffffffffffffe78;
          }
          bVar3 = MatchHeader(pcVar9,(char *)hdata);
          FMemLump::~FMemLump((FMemLump *)(local_198 + 0x10));
          map = (MapData *)local_198._8_8_;
        } while (!bVar3);
        goto LAB_003fa3a4;
      }
    }
LAB_003fa3e7:
    FString::~FString((FString *)local_138);
    strcpy((char *)local_138,(char *)local_140);
    pcVar9 = strrchr((char *)local_138,0x2e);
    if (pcVar9 == (char *)0x0) goto LAB_003fa46b;
    builtin_strncpy(pcVar9,".gwa",5);
    pFVar11 = FResourceFile::OpenResourceFile((char *)local_138,(FileReader *)0x0,true,false);
    map = (MapData *)local_198._8_8_;
    if (pFVar11 == (FResourceFile *)0x0) {
      return false;
    }
    pcVar9 = FWadCollection::GetLumpFullName(&Wads,*(int *)(local_198._8_8_ + 0xd4));
    strncpy((char *)map,pcVar9,8);
  }
  else {
LAB_003fa46b:
    if (pFVar11 == (FResourceFile *)0x0) {
      bVar3 = false;
      goto LAB_003fa56c;
    }
  }
  local_198[0] = -0x54;
  local_198[1] = '=';
  local_198[2] = 'r';
  local_198[3] = '\0';
  local_198[4] = '\0';
  local_198[5] = '\0';
  local_198[6] = '\0';
  local_198[7] = '\0';
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  uVar1 = pFVar11->NumLumps;
  FString::Format((FString *)local_198,"GL_%.8s",map);
  uVar2 = *(uint *)(local_198._0_8_ + -0xc);
  if (8 < uVar2) {
    FString::operator=((FString *)local_198,"GL_LEVEL");
  }
  if (4 < uVar1) {
    uVar17 = 0;
    do {
      iVar4 = (*pFVar11->_vptr_FResourceFile[4])(pFVar11,(ulong)uVar17);
      iVar4 = strncasecmp((char *)(CONCAT44(extraout_var,iVar4) + 0x18),(char *)local_198._0_8_,8);
      if (iVar4 == 0) {
        if (8 < uVar2) {
          local_198[0x10] = '\0';
          cStack_187 = '\0';
          cStack_186 = '\0';
          cStack_185 = '\0';
          cStack_184 = '\0';
          cStack_183 = '\0';
          cStack_182 = '\0';
          cStack_181 = '\0';
          _cStack_180 = (FileReader *)0x0;
          iVar4 = (*pFVar11->_vptr_FResourceFile[4])(pFVar11,(ulong)uVar17);
          plVar12 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x10))
                                      ((long *)CONCAT44(extraout_var_00,iVar4));
          (**(code **)(*plVar12 + 0x10))(plVar12,local_198 + 0x10,0x10);
          bVar3 = MatchHeader((char *)local_198._8_8_,local_198 + 0x10);
          if (!bVar3) goto LAB_003fa53d;
        }
        FString::~FString((FString *)local_198);
        uVar17 = uVar17 + 1;
        if (uVar17 == 0) goto LAB_003fa54d;
        __s2 = P_LoadGLNodes::check;
        lVar16 = 0;
        goto LAB_003fa5b4;
      }
LAB_003fa53d:
      uVar17 = uVar17 + 1;
    } while (uVar1 - 4 != uVar17);
  }
  FString::~FString((FString *)local_198);
LAB_003fa54d:
  bVar3 = false;
  goto LAB_003fa550;
  while( true ) {
    iVar4 = (*pFVar11->_vptr_FResourceFile[4])(pFVar11,(ulong)uVar17);
    uVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar4) + 0x18))
                       ((long *)CONCAT44(extraout_var_02,iVar4));
    *(undefined8 *)(local_168.Name + lVar16 * 8) = uVar13;
    lVar16 = lVar16 + 1;
    uVar17 = uVar17 + 1;
    __s2 = __s2 + 1;
    if (lVar16 == 4) break;
LAB_003fa5b4:
    iVar4 = (*pFVar11->_vptr_FResourceFile[4])(pFVar11,(ulong)uVar17);
    iVar4 = strncasecmp((char *)(CONCAT44(extraout_var_01,iVar4) + 0x18),*__s2,8);
    if (iVar4 != 0) goto LAB_003fa54d;
  }
  bVar3 = DoLoadGLNodes((FileReader **)&local_168);
LAB_003fa550:
  if (pFVar11 != *(FResourceFile **)(local_198._8_8_ + 0xe0)) {
    (*pFVar11->_vptr_FResourceFile[1])(pFVar11);
  }
LAB_003fa56c:
  lVar16 = 0;
  do {
    if (*(long **)(local_168.Name + lVar16 * 8) != (long *)0x0) {
      (**(code **)(**(long **)(local_168.Name + lVar16 * 8) + 8))();
    }
    lVar16 = lVar16 + 1;
  } while (lVar16 != 4);
  return bVar3;
}

Assistant:

bool P_LoadGLNodes(MapData * map)
{
	if (map->MapLumps[ML_GLZNODES].Reader && map->MapLumps[ML_GLZNODES].Reader->GetLength() != 0)
	{
		const int idcheck1a = MAKE_ID('Z','G','L','N');
		const int idcheck2a = MAKE_ID('Z','G','L','2');
		const int idcheck3a = MAKE_ID('Z','G','L','3');
		const int idcheck1b = MAKE_ID('X','G','L','N');
		const int idcheck2b = MAKE_ID('X','G','L','2');
		const int idcheck3b = MAKE_ID('X','G','L','3');
		int id;

		map->Seek(ML_GLZNODES);
		map->file->Read (&id, 4);
		if (id == idcheck1a || id == idcheck2a || id == idcheck3a ||
			id == idcheck1b || id == idcheck2b || id == idcheck3b)
		{
			try
			{
				subsectors = NULL;
				segs = NULL;
				nodes = NULL;
				P_LoadZNodes (*map->file, id);
				return true;
			}
			catch (CRecoverableError &)
			{
				if (subsectors != NULL)
				{
					delete[] subsectors;
					subsectors = NULL;
				}
				if (segs != NULL)
				{
					delete[] segs;
					segs = NULL;
				}
				if (nodes != NULL)
				{
					delete[] nodes;
					nodes = NULL;
				}
			}
		}
	}

	if (!CheckCachedNodes(map))
	{
		FileReader *gwalumps[4] = { NULL, NULL, NULL, NULL };
		char path[256];
		int li;
		int lumpfile = Wads.GetLumpFile(map->lumpnum);
		bool mapinwad = map->InWad;
		FResourceFile * f_gwa = map->resource;

		const char * name = Wads.GetWadFullName(lumpfile);

		if (mapinwad)
		{
			li = FindGLNodesInWAD(map->lumpnum);

			if (li>=0)
			{
				// GL nodes are loaded with a WAD
				for(int i=0;i<4;i++)
				{
					gwalumps[i]=Wads.ReopenLumpNum(li+i+1);
				}
				return DoLoadGLNodes(gwalumps);
			}
			else
			{
				strcpy(path, name);

				char * ext = strrchr(path, '.');
				if (ext)
				{
					strcpy(ext, ".gwa");
					// Todo: Compare file dates

					f_gwa = FResourceFile::OpenResourceFile(path, NULL, true);
					if (f_gwa==NULL) return false;

					strncpy(map->MapLumps[0].Name, Wads.GetLumpFullName(map->lumpnum), 8);
				}
			}
		}

		bool result = false;
		li = FindGLNodesInFile(f_gwa, map->MapLumps[0].Name);
		if (li!=-1)
		{
			static const char check[][9]={"GL_VERT","GL_SEGS","GL_SSECT","GL_NODES"};
			result=true;
			for(unsigned i=0; i<4;i++)
			{
				if (strnicmp(f_gwa->GetLump(li+i+1)->Name, check[i], 8))
				{
					result=false;
					break;
				}
				else
					gwalumps[i] = f_gwa->GetLump(li+i+1)->NewReader();
			}
			if (result) result = DoLoadGLNodes(gwalumps);
		}

		if (f_gwa != map->resource)
			delete f_gwa;
		for(unsigned int i = 0;i < 4;++i)
			delete gwalumps[i];
		return result;
	}
	else return true;
}